

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSaucy.c
# Opt level: O0

void split_common(saucy *s,coloring *c,int cf,int ff)

{
  int ff_local;
  int cf_local;
  coloring *c_local;
  saucy *s_local;
  
  split_color(c,cf,ff);
  if ((s->indmark[cf] == '\0') && (c->clen[cf] <= c->clen[ff])) {
    add_induce(s,c,cf);
  }
  else {
    add_induce(s,c,ff);
  }
  return;
}

Assistant:

static void
split_common(struct saucy *s, struct coloring *c, int cf, int ff)
{
    split_color(c, cf, ff);

    /* Add to refinement */
    if (s->indmark[cf] || c->clen[ff] < c->clen[cf]) {
        add_induce(s, c, ff);
    }
    else {
        add_induce(s, c, cf);
    }
}